

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O0

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
          *fadexpr)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  Fad<double> *in_RDI;
  value_type vVar5;
  int in_stack_0000000c;
  int i_1;
  int i;
  double *dxp;
  int sz;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar6;
  int local_28;
  int local_24;
  
  iVar2 = FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
          ::size((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                  *)0x1529f31);
  iVar6 = iVar2;
  iVar3 = Vector<double>::size((Vector<double> *)0x1529f4a);
  if (iVar6 != iVar3) {
    Vector<double>::resize(_i_1,in_stack_0000000c);
  }
  if (iVar2 != 0) {
    pdVar4 = Vector<double>::begin(&in_RDI->dx_);
    bVar1 = FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
            ::hasFastAccess((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                             *)0x1529f8c);
    if (bVar1) {
      for (local_24 = 0; local_24 < iVar2; local_24 = local_24 + 1) {
        vVar5 = FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                ::fastAccessDx((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                                *)CONCAT44(iVar6,in_stack_ffffffffffffffd0),
                               (int)((ulong)in_RDI >> 0x20));
        pdVar4[local_24] = vVar5;
      }
    }
    else {
      for (local_28 = 0; local_28 < iVar2; local_28 = local_28 + 1) {
        vVar5 = FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                ::dx((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                      *)CONCAT44(iVar6,in_stack_ffffffffffffffd0),(int)((ulong)in_RDI >> 0x20));
        pdVar4[local_28] = vVar5;
      }
    }
  }
  vVar5 = FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
          ::val((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                 *)0x152a01a);
  in_RDI->val_ = vVar5;
  return in_RDI;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}